

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::SectionStats::~SectionStats(SectionStats *this)

{
  void *in_RDI;
  
  ~SectionStats((SectionStats *)0x1a06f8);
  operator_delete(in_RDI);
  return;
}

Assistant:

SectionStats::~SectionStats() {}